

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kf_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_46c44b::KeyFrameIntervalTestLarge::~KeyFrameIntervalTestLarge
          (KeyFrameIntervalTestLarge *this)

{
  code *pcVar1;
  KeyFrameIntervalTestLarge *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

~KeyFrameIntervalTestLarge() override = default;